

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O0

int Cudd_PrintTwoLiteralClauses(DdManager *dd,DdNode *f,char **names,FILE *fp)

{
  uint uVar1;
  DdHalfWord *pDVar2;
  BitVector *vector;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  short sVar6;
  int iVar7;
  DdTlcInfo *t;
  FILE *local_60;
  FILE *ifp;
  DdTlcInfo *res;
  int i;
  BitVector *phases;
  DdHalfWord *vars;
  FILE *fp_local;
  char **names_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  t = Cudd_FindTwoLiteralClauses(dd,f);
  local_60 = (FILE *)fp;
  if (fp == (FILE *)0x0) {
    local_60 = (FILE *)dd->out;
  }
  if (t == (DdTlcInfo *)0x0) {
    dd_local._4_4_ = 0;
  }
  else {
    pDVar2 = t->vars;
    vector = t->phases;
    res._4_4_ = 0;
    while (iVar7 = sentinelp(pDVar2[res._4_4_],pDVar2[res._4_4_ + 1]), iVar7 == 0) {
      if (names == (char **)0x0) {
        if (pDVar2[res._4_4_ + 1] == 0x7fffffff) {
          sVar6 = bitVectorRead(vector,res._4_4_);
          pcVar4 = "\r\n\t ";
          if (sVar6 != 0) {
            pcVar4 = " & ~";
          }
          fprintf(local_60,"%s%d\n",pcVar4 + 3,(ulong)pDVar2[res._4_4_]);
        }
        else {
          sVar6 = bitVectorRead(vector,res._4_4_);
          pcVar4 = "\r\n\t ";
          if (sVar6 != 0) {
            pcVar4 = " & ~";
          }
          uVar1 = pDVar2[res._4_4_];
          sVar6 = bitVectorRead(vector,res._4_4_ + 1);
          pcVar3 = "\r\n\t ";
          if (sVar6 != 0) {
            pcVar3 = " & ~";
          }
          fprintf(local_60,"%s%d | %s%d\n",pcVar4 + 3,(ulong)uVar1,pcVar3 + 3,
                  (ulong)pDVar2[res._4_4_ + 1]);
        }
      }
      else if (pDVar2[res._4_4_ + 1] == 0x7fffffff) {
        sVar6 = bitVectorRead(vector,res._4_4_);
        pcVar4 = "\r\n\t ";
        if (sVar6 != 0) {
          pcVar4 = " & ~";
        }
        fprintf(local_60,"%s%s\n",pcVar4 + 3,names[pDVar2[res._4_4_]]);
      }
      else {
        sVar6 = bitVectorRead(vector,res._4_4_);
        pcVar4 = "\r\n\t ";
        if (sVar6 != 0) {
          pcVar4 = " & ~";
        }
        pcVar3 = names[pDVar2[res._4_4_]];
        sVar6 = bitVectorRead(vector,res._4_4_ + 1);
        pcVar5 = "\r\n\t ";
        if (sVar6 != 0) {
          pcVar5 = " & ~";
        }
        fprintf(local_60,"%s%s | %s%s\n",pcVar4 + 3,pcVar3,pcVar5 + 3,names[pDVar2[res._4_4_ + 1]]);
      }
      res._4_4_ = res._4_4_ + 2;
    }
    Cudd_tlcInfoFree(t);
    dd_local._4_4_ = 1;
  }
  return dd_local._4_4_;
}

Assistant:

int
Cudd_PrintTwoLiteralClauses(
  DdManager * dd,
  DdNode * f,
  char **names,
  FILE *fp)
{
    DdHalfWord *vars;
    BitVector *phases;
    int i;
    DdTlcInfo *res = Cudd_FindTwoLiteralClauses(dd, f);
    FILE *ifp = fp == NULL ? dd->out : fp;

    if (res == NULL) return(0);
    vars = res->vars;
    phases = res->phases;
    for (i = 0; !sentinelp(vars[i], vars[i+1]); i += 2) {
        if (names != NULL) {
            if (vars[i+1] == CUDD_MAXINDEX) {
                (void) fprintf(ifp, "%s%s\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               names[vars[i]]);
            } else {
                (void) fprintf(ifp, "%s%s | %s%s\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               names[vars[i]],
                               bitVectorRead(phases, i+1) ? "~" : " ",
                               names[vars[i+1]]);
            }
        } else {
            if (vars[i+1] == CUDD_MAXINDEX) {
                (void) fprintf(ifp, "%s%d\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               (int) vars[i]);
            } else {
                (void) fprintf(ifp, "%s%d | %s%d\n",
                               bitVectorRead(phases, i) ? "~" : " ",
                               (int) vars[i],
                               bitVectorRead(phases, i+1) ? "~" : " ",
                               (int) vars[i+1]);
            }
        }
    }
    Cudd_tlcInfoFree(res);

    return(1);

}